

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

QLayoutItem * __thiscall QToolBarAreaLayout::takeAt(QToolBarAreaLayout *this,int *x,int index)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  QList<QToolBarAreaLayoutLine> *this_00;
  long i_00;
  qsizetype qVar4;
  reference pQVar5;
  int in_EDX;
  int *in_RSI;
  QList<QToolBarAreaLayoutItem> *in_RDI;
  long in_FS_OFFSET;
  QLayoutItem *result;
  int k;
  QToolBarAreaLayoutLine *line;
  int j;
  QToolBarAreaLayoutInfo *dock;
  int i;
  qsizetype in_stack_ffffffffffffff78;
  QList<QToolBarAreaLayoutLine> *in_stack_ffffffffffffff80;
  int local_5c;
  int local_4c;
  int local_40;
  QLayoutItem *local_28;
  QLayoutItem *local_20;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = 0;
  do {
    if (3 < local_40) {
      local_28 = (QLayoutItem *)0x0;
LAB_006f33d1:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return local_28;
    }
    this_00 = (QList<QToolBarAreaLayoutLine> *)((long)in_RDI + (long)local_40 * 0x38 + 0x18);
    local_4c = 0;
    while( true ) {
      i_00 = (long)local_4c;
      qVar4 = QList<QToolBarAreaLayoutLine>::size(this_00);
      if (qVar4 <= i_00) break;
      pQVar5 = QList<QToolBarAreaLayoutLine>::operator[]
                         (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      local_5c = 0;
      while( true ) {
        in_stack_ffffffffffffff80 = (QList<QToolBarAreaLayoutLine> *)(long)local_5c;
        qVar4 = QList<QToolBarAreaLayoutItem>::size(&pQVar5->toolBarItems);
        if (qVar4 <= (long)in_stack_ffffffffffffff80) break;
        iVar1 = *in_RSI;
        *in_RSI = iVar1 + 1;
        if (iVar1 == in_EDX) {
          QList<QToolBarAreaLayoutItem>::takeAt(in_RDI,i_00);
          bVar3 = QList<QToolBarAreaLayoutItem>::isEmpty((QList<QToolBarAreaLayoutItem> *)0x6f3371);
          if (bVar3) {
            QList<QToolBarAreaLayoutLine>::removeAt
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          }
          local_28 = local_20;
          goto LAB_006f33d1;
        }
        local_5c = local_5c + 1;
      }
      local_4c = local_4c + 1;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

QLayoutItem *QToolBarAreaLayout::takeAt(int *x, int index)
{
    Q_ASSERT(x != nullptr);

    for (int i = 0; i < QInternal::DockCount; ++i) {
        QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            QToolBarAreaLayoutLine &line = dock.lines[j];

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if ((*x)++ == index) {
                    QLayoutItem *result = line.toolBarItems.takeAt(k).widgetItem;
                    if (line.toolBarItems.isEmpty())
                        dock.lines.removeAt(j);
                    return result;
                }
            }
        }
    }

    return nullptr;
}